

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 7zArcIn.c
# Opt level: O2

void SzAr_Free(CSzAr *p,ISzAlloc *alloc)

{
  (*alloc->Free)(alloc,p->PackPositions);
  SzBitUi32s_Free(&p->FolderCRCs,alloc);
  (*alloc->Free)(alloc,p->FoCodersOffsets);
  (*alloc->Free)(alloc,p->FoStartPackStreamIndex);
  (*alloc->Free)(alloc,p->FoToCoderUnpackSizes);
  (*alloc->Free)(alloc,p->FoToMainUnpackSizeIndex);
  (*alloc->Free)(alloc,p->CoderUnpackSizes);
  (*alloc->Free)(alloc,p->CodersData);
  p->CoderUnpackSizes = (UInt64 *)0x0;
  p->CodersData = (Byte *)0x0;
  p->FoToCoderUnpackSizes = (UInt32 *)0x0;
  p->FoToMainUnpackSizeIndex = (Byte *)0x0;
  p->FoCodersOffsets = (size_t *)0x0;
  p->FoStartPackStreamIndex = (UInt32 *)0x0;
  (p->FolderCRCs).Defs = (Byte *)0x0;
  (p->FolderCRCs).Vals = (UInt32 *)0x0;
  p->NumPackStreams = 0;
  p->NumFolders = 0;
  p->PackPositions = (UInt64 *)0x0;
  return;
}

Assistant:

static void SzAr_Free(CSzAr *p, ISzAlloc *alloc)
{
  IAlloc_Free(alloc, p->PackPositions);
  SzBitUi32s_Free(&p->FolderCRCs, alloc);
 
  IAlloc_Free(alloc, p->FoCodersOffsets);
  IAlloc_Free(alloc, p->FoStartPackStreamIndex);
  IAlloc_Free(alloc, p->FoToCoderUnpackSizes);
  IAlloc_Free(alloc, p->FoToMainUnpackSizeIndex);
  IAlloc_Free(alloc, p->CoderUnpackSizes);
  
  IAlloc_Free(alloc, p->CodersData);

  SzAr_Init(p);
}